

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec3.h
# Opt level: O1

long vec3::random(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double dVar4;
  
  dVar4 = in_XMM1_Qa - in_XMM0_Qa;
  iVar1 = rand();
  iVar2 = rand();
  iVar3 = rand();
  *in_RDI = (double)iVar1 * 4.656612873077393e-10 * dVar4 + in_XMM0_Qa;
  in_RDI[1] = (double)iVar2 * 4.656612873077393e-10 * dVar4 + in_XMM0_Qa;
  in_RDI[2] = (double)iVar3 * 4.656612873077393e-10 * dVar4 + in_XMM0_Qa;
  return (long)in_RDI;
}

Assistant:

static vec3 random(double min, double max) {
        return vec3(random_double(min,max), random_double(min,max), random_double(min,max));
    }